

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImDrawDataBuilder::ClearFreeMemory(ImDrawDataBuilder *this)

{
  int *piVar1;
  ImDrawList **ppIVar2;
  bool bVar3;
  bool bVar4;
  ImVector<ImDrawList_*> *pIVar5;
  long lVar6;
  
  lVar6 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    ppIVar2 = this->Layers[lVar6].Data;
    if (ppIVar2 != (ImDrawList **)0x0) {
      pIVar5 = this->Layers + lVar6;
      pIVar5->Size = 0;
      pIVar5->Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
      pIVar5->Data = (ImDrawList **)0x0;
    }
    lVar6 = 1;
    bVar3 = false;
  } while (bVar4);
  return;
}

Assistant:

void ClearFreeMemory()  { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].clear(); }